

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O1

void __thiscall
Clone_modelWithComponents_Test::~Clone_modelWithComponents_Test
          (Clone_modelWithComponents_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Clone, modelWithComponents)
{
    auto m = libcellml::Model::create();
    m->setId("unique_model");
    m->setName("model");

    auto c = libcellml::Component::create();
    auto c1 = libcellml::Component::create();
    auto c2 = libcellml::Component::create();

    c->setId("unique");
    c->setName("copy");
    c1->setName("child_1");
    c2->setName("child_2");

    c->addComponent(c1);
    c->addComponent(c2);

    m->addComponent(c);

    auto mClone = m->clone();

    compareModel(m, mClone);
}